

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# correlated_normal_dist.hpp
# Opt level: O0

result_type __thiscall
trng::correlated_normal_dist<double>::operator()(correlated_normal_dist<double> *this,lcg64 *r)

{
  size_type sVar1;
  size_type sVar2;
  param_type *in_RSI;
  param_type *in_RDI;
  vector<double,_std::allocator<double>_> *normal;
  result_type rVar3;
  result_type y;
  param_type *__x;
  
  __x = in_RDI + 1;
  utility::uniformoo<double,trng::lcg64>((lcg64 *)0x101daa);
  normal = (vector<double,_std::allocator<double>_> *)math::inv_Phi(5.21819783496379e-318);
  std::vector<double,_std::allocator<double>_>::push_back(&in_RDI->H_,(value_type *)__x);
  rVar3 = param_type::H_times(in_RSI,normal);
  sVar1 = std::vector<double,_std::allocator<double>_>::size(&in_RDI[1].H_);
  sVar2 = param_type::d(in_RDI);
  if (sVar1 == sVar2) {
    std::vector<double,_std::allocator<double>_>::clear
              ((vector<double,_std::allocator<double>_> *)0x101e12);
  }
  return rVar3;
}

Assistant:

result_type operator()(R &r) {
      normal_.push_back(trng::math::inv_Phi(utility::uniformoo<result_type>(r)));
      result_type y{P.H_times(normal_)};
      if (normal_.size() == P.d())
        normal_.clear();
      return y;
    }